

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O3

apx_error_t
apx_socketServerConnection_create(apx_socketServerConnection_t *self,msocket_t *socket_object)

{
  int iVar1;
  apx_connectionBaseVTable_t base_connection_vtable;
  apx_connectionInterface_t connection_interface;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  code *pcStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [48];
  apx_socketServerConnection_t *local_68;
  code *local_60;
  code *local_58;
  code *local_50;
  code *local_48;
  code *local_40;
  code *local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  iVar1 = 1;
  if (socket_object != (msocket_t *)0x0 && self != (apx_socketServerConnection_t *)0x0) {
    pthread_mutex_init((pthread_mutex_t *)&self->lock,(pthread_mutexattr_t *)0x0);
    self->default_buffer_size = 0x1000;
    self->pending_bytes = 0;
    apx_connectionBaseVTable_create
              (local_98,apx_socketServerConnection_vdestroy,apx_socketServerConnection_vstart,
               apx_socketServerConnection_vclose);
    local_30 = 0;
    uStack_28 = 0;
    local_60 = apx_socketServerConnection_vtransmit_max_bytes_avaiable;
    local_58 = apx_socketServerConnection_vtransmit_current_bytes_avaiable;
    local_50 = apx_socketServerConnection_vtransmit_begin;
    local_48 = apx_socketServerConnection_vtransmit_end;
    local_40 = apx_socketServerConnection_vtransmit_data_message;
    local_38 = apx_socketServerConnection_vtransmit_direct_message;
    local_68 = self;
    iVar1 = apx_serverConnection_create(self,local_98);
    if (iVar1 == 0) {
      adt_bytearray_create(&self->send_buffer,0x1000);
      uStack_a0 = 0;
      local_b8 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_a8 = socket_data_notification;
      pcStack_b0 = socket_disconnected_notification;
      self->socket_object = socket_object;
      msocket_set_handler(socket_object,&local_c8,self);
      apx_nodeManager_create(&self->node_manager,2);
      apx_serverConnection_attach_node_manager(self,&self->node_manager);
    }
  }
  return iVar1;
}

Assistant:

apx_error_t apx_socketServerConnection_create(apx_socketServerConnection_t *self, SOCKET_TYPE *socket_object)
{
   if ( (self != NULL) && (socket_object != NULL) )
   {
      apx_connectionBaseVTable_t base_connection_vtable;
      apx_connectionInterface_t connection_interface;
      MUTEX_INIT(self->lock);
      self->default_buffer_size = SEND_BUFFER_GROW_SIZE;
      self->pending_bytes = 0u;
      apx_connectionBaseVTable_create(&base_connection_vtable,
         apx_socketServerConnection_vdestroy,
         apx_socketServerConnection_vstart,
         apx_socketServerConnection_vclose);
      create_connection_interface_vtable(self, &connection_interface);
      apx_error_t retval = apx_serverConnection_create(&self->base, &base_connection_vtable, &connection_interface);
      if (retval == APX_NO_ERROR)
      {
         adt_bytearray_create(&self->send_buffer, SEND_BUFFER_GROW_SIZE);
         register_msocket_handler(self, socket_object);
      }
      if (retval == APX_NO_ERROR)
      {
         apx_nodeManager_create(&self->node_manager, APX_SERVER_MODE);
         apx_serverConnection_attach_node_manager(&self->base, &self->node_manager);
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}